

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astLiteralNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_astLiteralNode_t *analyzedNode;
  sysbvm_astLiteralNode_t *literalNode;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  context_local = (sysbvm_context_t *)*arguments;
  if ((context_local->heap).totalCapacity == 0) {
    context_local =
         (sysbvm_context_t *)sysbvm_context_shallowCopy(context,(sysbvm_tuple_t)context_local);
    sVar1 = sysbvm_tuple_getType(context,(context_local->heap).nextGCSizeThreshold);
    (context_local->heap).totalCapacity = sVar1;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLiteralNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_astLiteralNode_t *literalNode = (sysbvm_astLiteralNode_t *)arguments[0];
    //sysbvm_tuple_t *environment = &arguments[1];

    if(literalNode->super.analyzedType)
        return (sysbvm_tuple_t)literalNode;

    sysbvm_astLiteralNode_t *analyzedNode = (sysbvm_astLiteralNode_t*)sysbvm_context_shallowCopy(context, (sysbvm_tuple_t)literalNode);
    analyzedNode->super.analyzedType = sysbvm_tuple_getType(context, analyzedNode->value);
    return (sysbvm_tuple_t)analyzedNode;
}